

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall AllFloatsWriteTest::RunShard(AllFloatsWriteTest *this,int shard)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  uint32_t them_bits;
  float them_float;
  char *endptr;
  int top_byte;
  int last_top_byte;
  uint32_t bits;
  uint32_t last_bits;
  char buffer [100];
  int shard_local;
  AllFloatsWriteTest *this_local;
  
  last_top_byte = 0;
  endptr._4_4_ = 0xffffffff;
  top_byte = shard;
  buffer._92_4_ = shard;
  unique0x1000021f = this;
  do {
    if ((uint)top_byte < (uint)last_top_byte) {
      if (buffer._92_4_ == 0) {
        printf("done.\n");
        fflush(_stdout);
      }
      return;
    }
    if ((buffer._92_4_ == 0) &&
       (endptr._0_4_ = (uint)top_byte >> 0x18, (uint)endptr != endptr._4_4_)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)(uint)top_byte,
             (ulong)(uint)(int)(((double)(uint)top_byte * 100.0) / 4294967295.0));
      fflush(_stdout);
      endptr._4_4_ = (uint)endptr;
    }
    bVar1 = is_infinity_or_nan(top_byte);
    if (!bVar1) {
      wabt::WriteFloatHex((char *)&bits,100,top_byte);
      gtest_ar.message_.ptr_._4_4_ = strtof((char *)&bits,(char **)&them_bits);
      gtest_ar.message_.ptr_._0_4_ = bit_cast<unsigned_int,float>(gtest_ar.message_.ptr_._4_4_);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_a8,"bits","them_bits",(uint *)&top_byte,
                 (uint *)&gtest_ar.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0x87,message);
        testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        testing::Message::~Message(&local_b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      if (!bVar1) {
        return;
      }
    }
    last_top_byte = top_byte;
    top_byte = (this->super_ThreadedTest).num_threads_ + top_byte;
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      WriteFloatHex(buffer, sizeof(buffer), bits);

      char* endptr;
      float them_float = strtof(buffer, &endptr);
      uint32_t them_bits = bit_cast<uint32_t>(them_float);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }